

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

pair<long,_long> ParseDescriptorRange(UniValue *value)

{
  ulong uVar1;
  long lVar2;
  UniValue *pUVar3;
  long in_FS_OFFSET;
  pair<long,_long> pVar4;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (value->typ == VARR) {
    if ((((long)(value->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(value->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start == 0xb0) &&
        (pUVar3 = UniValue::operator[](value,0), pUVar3->typ == VNUM)) &&
       (pUVar3 = UniValue::operator[](value,1), pUVar3->typ == VNUM)) {
      pUVar3 = UniValue::operator[](value,0);
      lVar2 = UniValue::getInt<long>(pUVar3);
      pUVar3 = UniValue::operator[](value,1);
      uVar1 = UniValue::getInt<long>(pUVar3);
      if ((long)uVar1 < lVar2) {
        pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,
                   "Range specified as [begin,end] must not have begin after end",&local_41);
        JSONRPCError(pUVar3,-8,&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00301108;
      }
      if (lVar2 < 0) {
        pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Range should be greater or equal than 0",&local_41);
        JSONRPCError(pUVar3,-8,&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00301108;
      }
      goto LAB_00300e6e;
    }
  }
  else if (value->typ == VNUM) {
    uVar1 = UniValue::getInt<long>(value);
    lVar2 = 0;
LAB_00300e6e:
    if (uVar1 >> 0x1f == 0) {
      if (uVar1 < lVar2 + 1000000U) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar4.second = uVar1;
          pVar4.first = lVar2;
          return pVar4;
        }
      }
      else {
        pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Range is too large",&local_41);
        JSONRPCError(pUVar3,-8,&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
    else {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"End of range is too high",&local_41);
      JSONRPCError(pUVar3,-8,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    goto LAB_00301108;
  }
  pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Range must be specified as end or as [begin,end]",&local_41);
  JSONRPCError(pUVar3,-8,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
  }
LAB_00301108:
  __stack_chk_fail();
}

Assistant:

std::pair<int64_t, int64_t> ParseDescriptorRange(const UniValue& value)
{
    int64_t low, high;
    std::tie(low, high) = ParseRange(value);
    if (low < 0) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Range should be greater or equal than 0");
    }
    if ((high >> 31) != 0) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "End of range is too high");
    }
    if (high >= low + 1000000) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Range is too large");
    }
    return {low, high};
}